

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphical_model.h
# Opt level: O2

ssize_t __thiscall
merlin::graphical_model::write(graphical_model *this,int __fd,void *__buf,size_t __n)

{
  pointer pdVar1;
  pointer pfVar2;
  ostream *poVar3;
  ulong uVar4;
  undefined4 in_register_00000034;
  ostream *poVar5;
  size_t i;
  ulong uVar6;
  long lVar7;
  size_t i_1;
  
  poVar5 = (ostream *)CONCAT44(in_register_00000034,__fd);
  poVar3 = std::operator<<(poVar5,"MARKOV");
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  std::endl<char,std::char_traits<char>>(poVar3);
  for (uVar6 = 0;
      pdVar1 = (this->m_dims).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start,
      uVar6 < (ulong)((long)(this->m_dims).super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)pdVar1 >> 3);
      uVar6 = uVar6 + 1) {
    poVar3 = std::ostream::_M_insert<double>(pdVar1[uVar6]);
    std::operator<<(poVar3," ");
  }
  std::endl<char,std::char_traits<char>>(poVar5);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  std::endl<char,std::char_traits<char>>(poVar3);
  uVar6 = 0;
  while( true ) {
    pfVar2 = (this->m_factors).super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(this->m_factors).
                       super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)pfVar2) / 0x60) <= uVar6) break;
    std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    for (lVar7 = 0;
        lVar7 != (long)*(pointer *)
                        ((long)&pfVar2[uVar6].v_.m_v.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_> +
                        8) -
                 *(long *)&pfVar2[uVar6].v_.m_v.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 >> 3; lVar7 = lVar7 + 1) {
      poVar3 = std::operator<<(poVar5," ");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    }
    std::endl<char,std::char_traits<char>>(poVar5);
    uVar6 = uVar6 + 1;
  }
  std::endl<char,std::char_traits<char>>(poVar5);
  uVar6 = 0;
  while( true ) {
    pfVar2 = (this->m_factors).super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar4 = ((long)(this->m_factors).
                   super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)pfVar2) / 0x60;
    if (uVar4 <= uVar6) break;
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    std::endl<char,std::char_traits<char>>(poVar3);
    for (uVar4 = 0;
        uVar4 < (ulong)((long)*(pointer *)
                               ((long)&pfVar2[uVar6].t_.
                                       super__Vector_base<double,_std::allocator<double>_>._M_impl +
                               8) -
                        *(long *)&pfVar2[uVar6].t_.
                                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data >> 3); uVar4 = uVar4 + 1) {
      poVar3 = std::operator<<(poVar5," ");
      lVar7 = *(long *)poVar3;
      *(uint *)(poVar3 + *(long *)(lVar7 + -0x18) + 0x18) =
           *(uint *)(poVar3 + *(long *)(lVar7 + -0x18) + 0x18) | 4;
      *(undefined8 *)(poVar3 + *(long *)(lVar7 + -0x18) + 8) = 8;
      std::ostream::_M_insert<double>
                (*(double *)
                  (*(long *)&pfVar2[uVar6].t_.super__Vector_base<double,_std::allocator<double>_>.
                             _M_impl.super__Vector_impl_data + uVar4 * 8));
    }
    poVar3 = std::endl<char,std::char_traits<char>>(poVar5);
    std::endl<char,std::char_traits<char>>(poVar3);
    uVar6 = uVar6 + 1;
  }
  return uVar4;
}

Assistant:

void write(std::ostream& os) {

		// Write the header
		os << "MARKOV" << std::endl;
		os << nvar() << std::endl;
		for (size_t i = 0; i < m_dims.size(); ++i) {
			os << m_dims[i] << " ";
		}
		os << std::endl;

		// Write the factor scopes
		os << num_factors() << std::endl;
		for (size_t i = 0; i < m_factors.size(); ++i) {
			const factor& f = m_factors[i];
			os << f.nvar();
			variable_set::const_iterator si = f.vars().begin();
			for (; si != f.vars().end(); ++si) {
				os << " " << (*si).label();
			}
			os << std::endl;
		}

		// Write the factor tables
		os << std::endl;
		for (size_t i = 0; i < m_factors.size(); ++i) {
			const factor& f = m_factors[i];
			os << f.numel() << std::endl;
			for (size_t j = 0; j < f.numel(); ++j) {
				os << " " << std::setiosflags(std::ios::fixed)
					<< std::setprecision(8) << f[j];
			}
			os << std::endl << std::endl;
		}
	}